

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d60_q0_zipcode.cpp
# Opt level: O0

bool __thiscall Letter::operator<(Letter *this,Letter *other)

{
  bool bVar1;
  Letter *other_local;
  Letter *this_local;
  
  if (this->zip == other->zip) {
    bVar1 = std::operator!=(&this->address,&other->address);
    if (bVar1) {
      this_local._7_1_ = std::operator<(&this->address,&other->address);
    }
    else {
      bVar1 = std::operator!=(&this->district,&other->district);
      if (bVar1) {
        this_local._7_1_ = std::operator<(&this->district,&other->district);
      }
      else {
        bVar1 = std::operator!=(&this->province,&other->province);
        if (bVar1) {
          this_local._7_1_ = std::operator<(&this->province,&other->province);
        }
        else {
          this_local._7_1_ = std::operator<(&this->name,&other->name);
        }
      }
    }
  }
  else {
    this_local._7_1_ = this->zip < other->zip;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const Letter &other) const {
        //**Begin Insert**
        if (this->zip != other.zip)  {
            return this->zip < other.zip;
        }
        else if (this->address != other.address) {
            return this->address < other.address;
        }
        else if (this->district != other.district) {
            return this->district < other.district;
        }
        else if (this->province != other.province) {
            return this->province < other.province;
        }
        else {
            return this->name < other.name;
        }
        //**End Insert**
    }